

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::pause_state_machine_exeuction(raft_server *this,size_t timeout_ms)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  uint64_t uVar4;
  char *pcVar5;
  long in_RSI;
  long in_RDI;
  timer_helper timer;
  undefined1 in_stack_ffffffffffffff1f;
  atomic<bool> *in_stack_ffffffffffffff20;
  raft_server *in_stack_ffffffffffffff28;
  timer_helper *in_stack_ffffffffffffff30;
  char *format;
  char *local_b8;
  timer_helper *in_stack_ffffffffffffff60;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19bd9a);
    iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19bdbd);
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff28);
      if (bVar1) {
        local_b8 = "PAUSED";
      }
      else {
        local_b8 = "ACTIVE";
      }
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff28);
      pcVar5 = "SLEEPING";
      if (bVar1) {
        pcVar5 = "RUNNING";
      }
      msg_if_given_abi_cxx11_
                ((char *)local_30,
                 "pause state machine execution, previously %s, state machine %s, timeout %zu ms",
                 local_b8,pcVar5,local_10);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"pause_state_machine_exeuction",0x375,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  std::atomic<bool>::operator=(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
  if (local_10 != 0) {
    timer_helper::timer_helper
              (in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
               SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0));
    wait_for_state_machine_pause(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19bf26);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (3 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19bf49);
        uVar4 = timer_helper::get_ms(in_stack_ffffffffffffff60);
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)peVar3);
        pcVar5 = "SLEEPING";
        if (bVar1) {
          pcVar5 = "RUNNING";
        }
        format = &stack0xffffffffffffff60;
        msg_if_given_abi_cxx11_(format,"waited %lu ms, state machine %s",uVar4,pcVar5);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"pause_state_machine_exeuction",0x380,format);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      }
    }
  }
  return;
}

Assistant:

void raft_server::pause_state_machine_exeuction(size_t timeout_ms) {
    p_in( "pause state machine execution, previously %s, state machine %s, "
          "timeout %zu ms",
          sm_commit_paused_ ? "PAUSED" : "ACTIVE",
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING",
          timeout_ms );
    sm_commit_paused_ = true;

    if (!timeout_ms) {
        return;
    }

    timer_helper timer;
    wait_for_state_machine_pause(timeout_ms);
    p_in( "waited %" PRIu64 " ms, state machine %s",
          timer.get_ms(),
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING" );
}